

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O3

bool __thiscall wasm::RemoveUnusedBrs::optimizeLoop(RemoveUnusedBrs *this,Loop *loop)

{
  Id IVar1;
  char *pcVar2;
  BranchSeeker *this_00;
  char *pcVar3;
  Index IVar4;
  Unary *pUVar5;
  Expression *pEVar6;
  Block *pBVar7;
  Break *ifTrue;
  If *pIVar8;
  BranchSeeker *pBVar9;
  BranchSeeker *pBVar10;
  BranchSeeker *any;
  Index IVar11;
  ulong uVar12;
  Expression **ppEVar13;
  bool bVar14;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  Name target;
  optional<wasm::Type> type;
  anon_class_8_1_911e227b local_1b0;
  anon_class_8_1_911e227b blockifyMerge;
  bool local_19c;
  bool local_cd;
  size_t local_88;
  size_t local_58;
  Name *local_50;
  Index local_44;
  BranchSeeker *local_40;
  Builder local_38;
  Builder builder;
  
  pcVar2 = (loop->name).super_IString.str._M_str;
  if (((((pcVar2 == (char *)0x0) ||
        (this_00 = (BranchSeeker *)loop->body,
        *(char *)&(this_00->
                  super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  ).
                  super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  .replacep != '\x01')) ||
       (pBVar9 = (BranchSeeker *)
                 (this_00->
                 super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 ).
                 super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 .stack.fixed._M_elems[1].currp, pBVar9 < (BranchSeeker *)0x2)) ||
      ((pcVar3 = *(char **)((this_00->
                            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            ).
                            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            .stack.fixed._M_elems[1].func + (long)pBVar9 * 8 + -8),
       *pcVar3 != '\x04' || (*(long *)(pcVar3 + 0x28) != 0)))) ||
     ((*(long *)(pcVar3 + 0x20) != 0 || (*(char **)(pcVar3 + 0x18) != pcVar2)))) {
    return false;
  }
  pBVar10 = (BranchSeeker *)(ulong)((Index)pBVar9 - 2);
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
       ).super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
       super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.currModule;
  if (pBVar10 < pBVar9) {
    local_50 = &loop->name;
    IVar11 = (Index)pBVar9;
    do {
      IVar11 = IVar11 - 1;
      pIVar8 = *(If **)((this_00->
                        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                        ).
                        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                        .stack.fixed._M_elems[1].func + (long)pBVar10 * 8);
      IVar1 = (pIVar8->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id;
      if (IVar1 == BreakId) {
        pEVar6 = *(Expression **)
                  &pIVar8[1].super_SpecificExpression<(wasm::Expression::Id)2>.super_Expression;
        if (pEVar6 == (Expression *)0x0) {
          return false;
        }
        if (pIVar8->ifFalse != (Expression *)0x0) {
          return false;
        }
        if (pIVar8->ifTrue == (Expression *)(loop->name).super_IString.str._M_str) {
          return false;
        }
        target.super_IString.str._M_str =
             (BranchSeeker *)((long)&pBVar9[-1].types._M_h._M_single_bucket + 6);
        if (pBVar10 == target.super_IString.str._M_str) {
          pUVar5 = Builder::makeUnary(&local_38,EqZInt32,pEVar6);
          *(Unary **)&pIVar8[1].super_SpecificExpression<(wasm::Expression::Id)2>.super_Expression =
               pUVar5;
          pEVar6 = pIVar8->ifTrue;
          *(Expression **)(pcVar3 + 0x10) = pIVar8->condition;
          *(Expression **)(pcVar3 + 0x18) = pEVar6;
          pEVar6 = (Expression *)(local_50->super_IString).str._M_str;
          pIVar8->condition = (Expression *)(local_50->super_IString).str._M_len;
          pIVar8->ifTrue = pEVar6;
          return true;
        }
        pEVar6 = (Expression *)
                 (this_00->
                 super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 ).
                 super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 .stack.fixed._M_elems[0].currp;
        if (pIVar8->ifTrue != pEVar6) {
          return false;
        }
        target.super_IString.str._M_len = (size_t)pEVar6;
        IVar4 = BranchUtils::BranchSeeker::count
                          (this_00,(Expression *)
                                   (this_00->
                                   super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                   ).
                                   super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                   .stack.fixed._M_elems[0].func,target);
        if (IVar4 != 1) {
          return false;
        }
        local_40 = *(BranchSeeker **)
                    &pIVar8[1].super_SpecificExpression<(wasm::Expression::Id)2>.super_Expression;
        uVar12 = 0;
        ifTrue = Builder::makeBreak(&local_38,(IString)*(IString *)&pIVar8->condition,
                                    (Expression *)0x0,(Expression *)0x0);
        pEVar6 = stealSlice(&local_38,(Block *)this_00,IVar11,
                            *(Index *)&(this_00->
                                       super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                       ).
                                       super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                       .stack.fixed._M_elems[1].currp);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar12;
        any = local_40;
        pIVar8 = Builder::makeIf(&local_38,(Expression *)local_40,(Expression *)ifTrue,pEVar6,type);
        if (pBVar10 < (BranchSeeker *)
                      (this_00->
                      super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      ).
                      super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      .stack.fixed._M_elems[1].currp) {
          *(If **)((this_00->
                   super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                   ).
                   super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                   .stack.fixed._M_elems[1].func + (long)pBVar10 * 8) = pIVar8;
LAB_00a845c2:
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)any;
          Block::finalize((Block *)this_00,type__00,Unknown);
          return true;
        }
        break;
      }
      if (IVar1 == IfId) {
        pBVar10 = (BranchSeeker *)pIVar8->ifFalse;
        if (pBVar10 == (BranchSeeker *)0x0) {
          if ((pIVar8->ifTrue->type).id != 1) {
            return false;
          }
          any = this_00;
          pEVar6 = stealSlice(&local_38,(Block *)this_00,IVar11,(Index)pBVar9);
          pIVar8->ifFalse = pEVar6;
        }
        else {
          if ((pIVar8->condition->type).id == 1) {
            return false;
          }
          if (1 < (pIVar8->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.
                  id) {
            __assert_fail("!iff->type.isConcrete()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                          ,0x279,"bool wasm::RemoveUnusedBrs::optimizeLoop(Loop *)");
          }
          local_1b0.builder = &local_38;
          any = (BranchSeeker *)pIVar8->ifTrue;
          if ((any->
              super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
              ).
              super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
              .stack.usedFixed == 1) {
            ppEVar13 = &pIVar8->ifFalse;
            any = pBVar10;
          }
          else {
            if ((pBVar10->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                ).
                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                .stack.usedFixed != 1) {
              return false;
            }
            ppEVar13 = &pIVar8->ifTrue;
          }
          pEVar6 = stealSlice(&local_38,(Block *)this_00,IVar11,(Index)pBVar9);
          pBVar7 = optimizeLoop::anon_class_8_1_911e227b::operator()
                             (&stack0xfffffffffffffe50,(Expression *)any,pEVar6);
          *ppEVar13 = (Expression *)pBVar7;
        }
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)any;
        If::finalize(pIVar8,type_);
        goto LAB_00a845c2;
      }
      local_44 = IVar11;
      local_40 = pBVar10;
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)&stack0xfffffffffffffe50,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                 ).
                 super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                 .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
                 currModule,(Expression *)pIVar8);
      bVar14 = true;
      if (((local_19c == false) && (local_cd == false)) && (local_58 == 0)) {
        bVar14 = local_88 != 0;
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&stack0xffffffffffffff80);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&stack0xffffffffffffff50);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&stack0xfffffffffffffef8);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&stack0xfffffffffffffec8);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&stack0xfffffffffffffe98);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&stack0xfffffffffffffe68);
      pBVar10 = (BranchSeeker *)((long)&local_40[-1].types._M_h._M_single_bucket + 7);
      if (local_40 == (BranchSeeker *)0x0) {
        return false;
      }
      if (bVar14) {
        return false;
      }
      pBVar9 = (BranchSeeker *)
               (this_00->
               super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               ).
               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               .stack.fixed._M_elems[1].currp;
      IVar11 = local_44;
    } while (pBVar10 < pBVar9);
  }
  __assert_fail("index < usedElements",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                ,0xbc,
                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

bool optimizeLoop(Loop* loop) {
    // if a loop ends in
    // (loop $in
    //   (block $out
    //     if (..) br $in; else br $out;
    //   )
    // )
    // then our normal opts can remove the break out since it flows directly out
    // (and later passes make the if one-armed). however, the simple analysis
    // fails on patterns like
    //     if (..) br $out;
    //     br $in;
    // which is a common way to do a while (1) loop (end it with a jump to the
    // top), so we handle that here. Specifically we want to conditionalize
    // breaks to the loop top, i.e., put them behind a condition, so that other
    // code can flow directly out and thus brs out can be removed. (even if
    // the change is to let a break somewhere else flow out, that can still be
    // helpful, as it shortens the logical loop. it is also good to generate
    // an if-else instead of an if, as it might allow an eqz to be removed
    // by flipping arms)
    if (!loop->name.is()) {
      return false;
    }
    auto* block = loop->body->dynCast<Block>();
    if (!block) {
      return false;
    }
    // does the last element break to the top of the loop?
    auto& list = block->list;
    if (list.size() <= 1) {
      return false;
    }
    auto* last = list.back()->dynCast<Break>();
    if (!last || !ExpressionAnalyzer::isSimple(last) ||
        last->name != loop->name) {
      return false;
    }
    // last is a simple break to the top of the loop. if we can conditionalize
    // it, it won't block things from flowing out and not needing breaks to do
    // so.
    Index i = list.size() - 2;
    Builder builder(*getModule());
    while (1) {
      auto* curr = list[i];
      if (auto* iff = curr->dynCast<If>()) {
        // let's try to move the code going to the top of the loop into the
        // if-else
        if (!iff->ifFalse) {
          // we need the ifTrue to break, so it cannot reach the code we want to
          // move
          if (iff->ifTrue->type == Type::unreachable) {
            iff->ifFalse = stealSlice(builder, block, i + 1, list.size());
            iff->finalize();
            block->finalize();
            return true;
          }
        } else if (iff->condition->type != Type::unreachable) {
          // This is already an if-else. If one side is a dead end, we can
          // append to the other, if there is no returned value to concern us.
          // Note that we skip ifs with unreachable conditions, as they are dead
          // code that DCE can remove, and modifying them can lead to errors
          // (one of the arms may still be concrete, in which case appending to
          // it would be invalid).

          // can't be, since in the middle of a block
          assert(!iff->type.isConcrete());

          // ensures the first node is a block, if it isn't already, and merges
          // in the second, either as a single element or, if a block, by
          // appending to the first block. this keeps the order of operations in
          // place, that is, the appended element will be executed after the
          // first node's elements
          auto blockifyMerge = [&](Expression* any,
                                   Expression* append) -> Block* {
            Block* block = nullptr;
            if (any) {
              block = any->dynCast<Block>();
            }
            // if the first isn't a block, or it's a block with a name (so we
            // might branch to the end, and so can't append to it, we might skip
            // that code!) then make a new block
            if (!block || block->name.is()) {
              block = builder.makeBlock(any);
            } else {
              assert(!block->type.isConcrete());
            }
            auto* other = append->dynCast<Block>();
            if (!other) {
              block->list.push_back(append);
            } else {
              for (auto* item : other->list) {
                block->list.push_back(item);
              }
            }
            block->finalize();
            return block;
          };

          if (iff->ifTrue->type == Type::unreachable) {
            iff->ifFalse = blockifyMerge(
              iff->ifFalse, stealSlice(builder, block, i + 1, list.size()));
            iff->finalize();
            block->finalize();
            return true;
          } else if (iff->ifFalse->type == Type::unreachable) {
            iff->ifTrue = blockifyMerge(
              iff->ifTrue, stealSlice(builder, block, i + 1, list.size()));
            iff->finalize();
            block->finalize();
            return true;
          }
        }
        return false;
      } else if (auto* brIf = curr->dynCast<Break>()) {
        // br_if is similar to if.
        if (brIf->condition && !brIf->value && brIf->name != loop->name) {
          if (i == list.size() - 2) {
            // there is the br_if, and then the br to the top, so just flip them
            // and the condition
            brIf->condition = builder.makeUnary(EqZInt32, brIf->condition);
            last->name = brIf->name;
            brIf->name = loop->name;
            return true;
          } else {
            // there are elements in the middle,
            //   br_if $somewhere (condition)
            //   (..more..)
            //   br $in
            // we can convert the br_if to an if. this has a cost, though,
            // so only do it if it looks useful, which it definitely is if
            //  (a) $somewhere is straight out (so the br out vanishes), and
            //  (b) this br_if is the only branch to that block (so the block
            //      will vanish)
            if (brIf->name == block->name &&
                BranchUtils::BranchSeeker::count(block, block->name) == 1) {
              // note that we could drop the last element here, it is a br we
              // know for sure is removable, but telling stealSlice to steal all
              // to the end is more efficient, it can just truncate.
              list[i] =
                builder.makeIf(brIf->condition,
                               builder.makeBreak(brIf->name),
                               stealSlice(builder, block, i + 1, list.size()));
              block->finalize();
              return true;
            }
          }
        }
        return false;
      }
      // if there is control flow, we must stop looking
      if (EffectAnalyzer(getPassOptions(), *getModule(), curr)
            .transfersControlFlow()) {
        return false;
      }
      if (i == 0) {
        return false;
      }
      i--;
    }
  }